

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# receive.cpp
# Opt level: O0

isminetype wallet::InputIsMine(CWallet *wallet,CTxIn *txin)

{
  long lVar1;
  CWalletTx *pCVar2;
  CWallet *pCVar3;
  CWallet *pCVar4;
  long in_RSI;
  CWallet *in_RDI;
  long in_FS_OFFSET;
  CWalletTx *prev;
  undefined4 in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  char *in_stack_ffffffffffffffc0;
  uint256 *in_stack_ffffffffffffffc8;
  undefined4 local_c;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  AssertLockHeldInternal<AnnotatedMixin<std::recursive_mutex>>
            ((char *)in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc,
             (AnnotatedMixin<std::recursive_mutex> *)0x9bfc74);
  pCVar3 = in_RDI;
  transaction_identifier::operator_cast_to_uint256_
            ((transaction_identifier<false> *)
             CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  pCVar2 = CWallet::GetWalletTx(pCVar3,in_stack_ffffffffffffffc8);
  if (pCVar2 != (CWalletTx *)0x0) {
    pCVar3 = (CWallet *)(ulong)*(uint *)(in_RSI + 0x20);
    std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
    pCVar4 = (CWallet *)
             std::vector<CTxOut,_std::allocator<CTxOut>_>::size
                       ((vector<CTxOut,_std::allocator<CTxOut>_> *)
                        CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
    if (pCVar3 < pCVar4) {
      std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
      std::vector<CTxOut,_std::allocator<CTxOut>_>::operator[]
                ((vector<CTxOut,_std::allocator<CTxOut>_> *)pCVar3,(size_type)in_RDI);
      local_c = CWallet::IsMine(pCVar3,(CTxOut *)in_RDI);
      goto LAB_009bfd25;
    }
  }
  local_c = ISMINE_NO;
LAB_009bfd25:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_c;
  }
  __stack_chk_fail();
}

Assistant:

isminetype InputIsMine(const CWallet& wallet, const CTxIn& txin)
{
    AssertLockHeld(wallet.cs_wallet);
    const CWalletTx* prev = wallet.GetWalletTx(txin.prevout.hash);
    if (prev && txin.prevout.n < prev->tx->vout.size()) {
        return wallet.IsMine(prev->tx->vout[txin.prevout.n]);
    }
    return ISMINE_NO;
}